

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.hpp
# Opt level: O2

void __thiscall duckdb::SecretManager::SecretManager(SecretManager *this)

{
  this->_vptr_SecretManager = (_func_int **)&PTR__SecretManager_0279fcd8;
  (this->manager_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->manager_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->manager_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->manager_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->manager_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->secret_functions)._M_h._M_buckets = &(this->secret_functions)._M_h._M_single_bucket;
  (this->secret_functions)._M_h._M_bucket_count = 1;
  (this->secret_functions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->secret_functions)._M_h._M_element_count = 0;
  (this->secret_functions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->secret_functions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->secret_functions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->secret_types)._M_h._M_buckets = &(this->secret_types)._M_h._M_single_bucket;
  (this->secret_types)._M_h._M_bucket_count = 1;
  (this->secret_types)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->secret_types)._M_h._M_element_count = 0;
  (this->secret_types)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->secret_types)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->secret_types)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->secret_storages)._M_h._M_buckets = &(this->secret_storages)._M_h._M_single_bucket;
  (this->secret_storages)._M_h._M_bucket_count = 1;
  (this->secret_storages)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->secret_storages)._M_h._M_element_count = 0;
  (this->secret_storages)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->secret_storages)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->secret_storages)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->initialized)._M_base._M_i = false;
  SecretManagerConfig::SecretManagerConfig(&this->config);
  (this->db).ptr = (DatabaseInstance *)0x0;
  return;
}

Assistant:

explicit SecretManager() = default;